

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::data<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  Lexer *this;
  ulong uVar1;
  undefined4 uVar2;
  size_t sVar3;
  bool bVar4;
  string *this_00;
  _Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *p_Var5;
  string_view expected;
  string_view expected_00;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  size_t local_f8;
  undefined4 uStack_f0;
  undefined1 local_e8 [8];
  MaybeResult<wasm::Name> mem;
  size_t local_b8;
  size_t local_b0;
  string local_a8 [32];
  undefined1 local_88 [8];
  Result<wasm::Ok> str;
  Result<wasm::Expression_*> _val_1;
  
  this = &ctx->in;
  uVar1 = (ctx->in).pos;
  expected._M_str = "data";
  expected._M_len = 4;
  bVar4 = Lexer::takeSExprStart(this,expected);
  if (!bVar4) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_e8,this);
  if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._8_1_ == '\0') {
    mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_index = '\0';
    mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._33_7_ = 0;
    local_b8 = 0;
  }
  else {
    mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ =
         mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.
         super_IString.str._M_len;
    local_b8 = (size_t)local_e8;
  }
  maybeMemuse<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_e8,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_88,
                  (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_e8);
  if (str.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
      .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
      _M_u._24_1_ == '\x02') {
    std::__cxx11::string::string
              ((string *)
               ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),(string *)local_88);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_88);
    goto LAB_00c55a24;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_88);
  expected_00._M_str = "offset";
  expected_00._M_len = 6;
  bVar4 = Lexer::takeSExprStart(this,expected_00);
  if (bVar4) {
    expr<wasm::WATParser::ParseDefsCtx>((Result<wasm::Expression_*> *)local_88,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
               ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_88);
    if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                (local_a8,(string *)
                          ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 local_a8);
      goto LAB_00c556f4;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                      ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    bVar4 = Lexer::takeRParen(this);
    if (bVar4) {
      local_b0 = (size_t)local_88;
LAB_00c55790:
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_88);
      _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._36_1_ = 1;
      goto LAB_00c5579a;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"expected end of offset expression",(allocator<char> *)local_a8)
    ;
    Lexer::err((Err *)((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),this,&local_178);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    this_00 = &local_178;
LAB_00c55932:
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    bVar4 = Lexer::takeLParen(this);
    if (!bVar4) {
      _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._36_1_ = 0;
LAB_00c5579a:
      if ((mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x01') &&
         (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._36_1_ == '\0')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"expected offset for active segment",
                   (allocator<char> *)
                   ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        Lexer::err((Err *)local_88,this,&local_138);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_88);
        std::__cxx11::string::~string((string *)local_88);
        std::__cxx11::string::~string((string *)&local_138);
        goto LAB_00c55a24;
      }
      datastring<wasm::WATParser::ParseDefsCtx>((Result<wasm::Ok> *)local_88,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                 (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_88);
      if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  (local_a8,(string *)
                            ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_a8);
LAB_00c557eb:
        std::__cxx11::string::~string(local_a8);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        bVar4 = Lexer::takeRParen(this);
        if (bVar4) {
          p_Var5 = (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)0x0;
          if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
            p_Var5 = (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_e8;
          }
          local_f8 = local_b0;
          sVar3 = local_f8;
          uStack_f0 = CONCAT31(uStack_f0._1_3_,
                               _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._36_1_);
          local_f8._0_4_ = (undefined4)local_b0;
          uVar2 = (undefined4)local_f8;
          local_f8 = sVar3;
          ParseDefsCtx::addData
                    ((__index_type *)
                     ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx,local_b8,
                     mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_,p_Var5,
                     uVar1 & 0xffffffff,uVar2,uStack_f0);
          if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__cxx11::string::string
                      (local_a8,(string *)
                                ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,local_a8);
            goto LAB_00c557eb;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"expected end of data segment",(allocator<char> *)local_a8
                    );
          Lexer::err((Err *)((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),this,
                     &local_118);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          std::__cxx11::string::~string((string *)&local_118);
        }
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
      goto LAB_00c55a24;
    }
    instr<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Ok> *)local_88,ctx);
    if (str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),(string *)local_88);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88);
      goto LAB_00c55a24;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88);
    ParseDefsCtx::makeExpr((Result<wasm::Expression_*> *)local_88,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
               ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_88);
    if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ != '\x01') {
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                        ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      local_b0 = (size_t)local_88;
      bVar4 = Lexer::takeRParen(this);
      if (bVar4) goto LAB_00c55790;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"expected end of offset instruction",
                 (allocator<char> *)local_a8);
      Lexer::err((Err *)((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),this,&local_158)
      ;
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      this_00 = &local_158;
      goto LAB_00c55932;
    }
    std::__cxx11::string::string
              (local_a8,(string *)
                        ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_a8);
LAB_00c556f4:
    std::__cxx11::string::~string(local_a8);
    std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                      ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_88);
LAB_00c55a24:
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> data(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("data"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto mem = maybeMemuse(ctx);
  CHECK_ERR(mem);

  std::optional<typename Ctx::ExprT> offset;
  if (ctx.in.takeSExprStart("offset"sv)) {
    auto e = expr(ctx);
    CHECK_ERR(e);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
    offset = *e;
  } else if (ctx.in.takeLParen()) {
    CHECK_ERR(instr(ctx));
    auto offsetExpr = ctx.makeExpr();
    CHECK_ERR(offsetExpr);
    offset = *offsetExpr;
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset instruction");
    }
  }

  if (mem && !offset) {
    return ctx.in.err("expected offset for active segment");
  }

  auto str = datastring(ctx);
  CHECK_ERR(str);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of data segment");
  }

  CHECK_ERR(ctx.addData(name, mem.getPtr(), offset, std::move(*str), pos));

  return Ok{};
}